

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O0

char * Token::token_type_name(Type *type)

{
  invalid_argument *this;
  Type *type_local;
  
  switch(*type) {
  case kEOF:
    type_local = (Type *)anon_var_dwarf_17142;
    break;
  case kRead:
    type_local = (Type *)(anon_var_dwarf_6e25e + 0x17);
    break;
  case kWrite:
    type_local = (Type *)anon_var_dwarf_1717b;
    break;
  case kWhile:
    type_local = (Type *)0x1c33d3;
    break;
  case kIf:
    type_local = (Type *)0x1c33ee;
    break;
  case kElse:
    type_local = (Type *)0x1c33e4;
    break;
  case kInt:
    type_local = (Type *)0x1c1b46;
    break;
  case kReal:
    type_local = (Type *)anon_var_dwarf_171c5;
    break;
  case kVoid:
    type_local = (Type *)(anon_var_dwarf_5f947 + 0x29);
    break;
  case kFunc:
    type_local = (Type *)anon_var_dwarf_171d9;
    break;
  case kReturn:
    type_local = (Type *)0x1c2075;
    break;
  case kLeftParen:
    type_local = (Type *)anon_var_dwarf_171f9;
    break;
  case kRightParen:
    type_local = (Type *)0x1c1393;
    break;
  case kLeftBracket:
    type_local = (Type *)anon_var_dwarf_17219;
    break;
  case kRightBracket:
    type_local = (Type *)0x1c1b1c;
    break;
  case kLeftBrace:
    type_local = (Type *)anon_var_dwarf_1722d;
    break;
  case kRightBrace:
    type_local = (Type *)anon_var_dwarf_17237;
    break;
  case kSemicolon:
    type_local = (Type *)anon_var_dwarf_17241;
    break;
  case kComma:
    type_local = (Type *)anon_var_dwarf_1724b;
    break;
  case kAssign:
    type_local = (Type *)0x1c155d;
    break;
  case kPlus:
    type_local = (Type *)anon_var_dwarf_1725f;
    break;
  case kMinus:
    type_local = (Type *)0x1c29d3;
    break;
  case kTimes:
    type_local = (Type *)0x1c1566;
    break;
  case kDivide:
    type_local = (Type *)0x1c1569;
    break;
  case kLT:
    type_local = (Type *)anon_var_dwarf_17287;
    break;
  case kLTE:
    type_local = (Type *)anon_var_dwarf_17291;
    break;
  case kGT:
    type_local = (Type *)(anon_var_dwarf_5f975 + 0x1b);
    break;
  case kGTE:
    type_local = (Type *)anon_var_dwarf_172a5;
    break;
  case kEqual:
    type_local = (Type *)0x1c29a3;
    break;
  case kNotEqual:
    type_local = (Type *)(anon_var_dwarf_5f975 + 0x1a);
    break;
  case kLineComment:
    type_local = (Type *)anon_var_dwarf_172c3;
    break;
  case kLeftBlockComment:
    type_local = (Type *)anon_var_dwarf_172cd;
    break;
  case kRightBlockComment:
    type_local = (Type *)anon_var_dwarf_172d7;
    break;
  case kIdentity:
    type_local = (Type *)anon_var_dwarf_172e1;
    break;
  case kIntegerLiteral:
    type_local = (Type *)anon_var_dwarf_172f7;
    break;
  case kRealLiteral:
    type_local = (Type *)anon_var_dwarf_1730d;
    break;
  case kWhiteSpace:
    type_local = (Type *)anon_var_dwarf_17323;
    break;
  case kProgram:
    type_local = (Type *)anon_var_dwarf_17339;
    break;
  case kStatements:
    type_local = (Type *)0x1c15e8;
    break;
  case kFunctions:
    type_local = (Type *)anon_var_dwarf_17365;
    break;
  case kStatement:
    type_local = (Type *)0x1c162f;
    break;
  case kFunction:
    type_local = (Type *)anon_var_dwarf_17385;
    break;
  case kFunctionParameters:
    type_local = (Type *)anon_var_dwarf_1738f;
    break;
  case kFunctionParameter:
    type_local = (Type *)anon_var_dwarf_173a5;
    break;
  case kFunctionStatements:
    type_local = (Type *)anon_var_dwarf_173bb;
    break;
  case kFunctionReturnStatement:
    type_local = (Type *)anon_var_dwarf_173c5;
    break;
  case kIfStatement:
    type_local = (Type *)anon_var_dwarf_173db;
    break;
  case kWhileStatement:
    type_local = (Type *)anon_var_dwarf_173e5;
    break;
  case kReadStatement:
    type_local = (Type *)anon_var_dwarf_173ef;
    break;
  case kWriteStatement:
    type_local = (Type *)anon_var_dwarf_17405;
    break;
  case kAssignStatement:
    type_local = (Type *)anon_var_dwarf_1740f;
    break;
  case kDeclareStatement:
    type_local = (Type *)anon_var_dwarf_17425;
    break;
  case kReturnStatement:
    type_local = (Type *)0x1c15fc;
    break;
  case kDeclareKeyword:
    type_local = (Type *)anon_var_dwarf_17445;
    break;
  case kIdentityArray:
    type_local = (Type *)anon_var_dwarf_1744f;
    break;
  case kCondition:
    type_local = (Type *)anon_var_dwarf_17459;
    break;
  case kExpression:
    type_local = (Type *)0x1c1cd3;
    break;
  case kTerm:
    type_local = (Type *)anon_var_dwarf_1746d;
    break;
  case kComparisonOp:
    type_local = (Type *)anon_var_dwarf_17477;
    break;
  case kAddOp:
    type_local = (Type *)anon_var_dwarf_1748d;
    break;
  case kMulOp:
    type_local = (Type *)anon_var_dwarf_17497;
    break;
  case kFactor:
    type_local = (Type *)anon_var_dwarf_174a1;
    break;
  case kArray:
    type_local = (Type *)0x1c16f8;
    break;
  case kFunctionCall:
    type_local = (Type *)anon_var_dwarf_174b5;
    break;
  case kFunctionCallParameters:
    type_local = (Type *)anon_var_dwarf_174bf;
    break;
  case kIntArray:
    type_local = (Type *)anon_var_dwarf_174df;
    break;
  case kRealArray:
    type_local = (Type *)anon_var_dwarf_174e9;
    break;
  case kNone:
    type_local = (Type *)anon_var_dwarf_174d5;
    break;
  default:
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"received invalid type value");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return (char *)type_local;
}

Assistant:

const char *Token::token_type_name(const Type &type) {
    switch (type) {
        case Type::kEOF: return "EOF";
        case Type::kRead: return "read";
        case Type::kWrite: return "write";
        case Type::kWhile: return "while";
        case Type::kIf: return "if";
        case Type::kElse: return "else";
        case Type::kInt: return "int";
        case Type::kReal: return "real";
        case Type::kVoid: return "void";
        case Type::kFunc: return "func";
        case Type::kReturn: return "return";
        case Type::kLeftParen: return "(";
        case Type::kRightParen: return ")";
        case Type::kLeftBracket: return "[";
        case Type::kRightBracket: return "]";
        case Type::kLeftBrace: return "{";
        case Type::kRightBrace: return "}";
        case Type::kSemicolon: return ";";
        case Type::kComma: return ",";
        case Type::kAssign: return "=";
        case Type::kPlus: return "+";
        case Type::kMinus: return "-";
        case Type::kTimes: return "*";
        case Type::kDivide: return "/";
        case Type::kLT: return "<";
        case Type::kLTE: return "<=";
        case Type::kGT: return ">";
        case Type::kGTE: return ">=";
        case Type::kEqual: return "==";
        case Type::kNotEqual: return "<>";
        case Type::kLineComment: return "//";
        case Type::kLeftBlockComment: return "/*";
        case Type::kRightBlockComment: return "*/";
        case Type::kIdentity: return "identity";
        case Type::kIntegerLiteral: return "integer_literal";
        case Type::kRealLiteral: return "real_literal";
        case Type::kWhiteSpace: return "white_space";
        case Type::kProgram: return "program";
        case Type::kStatements: return "statements";
        case Type::kFunctions: return "functions";
        case Type::kStatement: return "statement";
        case Type::kFunction: return "function";
        case Type::kFunctionParameters: return "function_parameters";
        case Type::kFunctionParameter: return "function_parameter";
        case Type::kFunctionStatements: return "function_statements";
        case Type::kFunctionReturnStatement: return "function_return_statement";
        case Type::kIfStatement: return "if_statement";
        case Type::kWhileStatement: return "while_statement";
        case Type::kReadStatement: return "read_statement";
        case Type::kWriteStatement: return "write_statement";
        case Type::kAssignStatement: return "assign_statement";
        case Type::kDeclareStatement: return "declare_statement";
        case Type::kReturnStatement: return "return_statement";
        case Type::kDeclareKeyword: return "declare_keyword";
        case Type::kIdentityArray: return "identity_array";
        case Type::kCondition: return "condition";
        case Type::kExpression: return "expression";
        case Type::kTerm: return "term";
        case Type::kComparisonOp: return "comparison_op";
        case Type::kAddOp: return "add_op";
        case Type::kMulOp: return "mul_op";
        case Type::kFactor: return "factor";
        case Type::kArray: return "array";
        case Type::kFunctionCall: return "function_call";
        case Type::kFunctionCallParameters: return "function_call_parameters";
        case Type::kNone: return "none";
        case Type::kIntArray: return "int_array";
        case Type::kRealArray: return "real_array";
        default: throw std::invalid_argument("received invalid type value");
    }
}